

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_(CompilerMSL *this,Parameter *arg)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  size_type sVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  SPIRVariable *in_RDX;
  BuiltIn builtin_00;
  bool local_423;
  bool local_422;
  bool local_421;
  undefined1 local_408 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  string local_3a8 [32];
  string local_388 [36];
  uint32_t local_364;
  SPIRVariable *local_360;
  SPIRVariable *backing_var;
  spirv_cross local_338 [32];
  undefined1 local_318 [64];
  spirv_cross local_2d8 [32];
  string local_2b8 [32];
  undefined1 local_298 [40];
  char *restrict_kw_1;
  spirv_cross local_268 [4];
  uint32_t desc_set;
  undefined1 local_248 [64];
  string local_208 [32];
  undefined1 local_1e8 [40];
  char *restrict_kw;
  string local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [39];
  byte local_171;
  string local_170 [7];
  bool opaque_handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  spirv_cross local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  spirv_cross local_f0 [36];
  uint32_t local_cc;
  undefined1 local_c8 [71];
  byte local_81;
  undefined1 local_80 [7];
  bool builtin;
  string address_space;
  key_type local_5c;
  bool local_55;
  bool is_dynamic_img_sampler;
  byte local_47;
  bool local_46;
  bool local_45;
  uint32_t local_44;
  bool type_is_image;
  bool constref;
  uint32_t name_id;
  bool is_pointer;
  SPIRType *pSStack_38;
  StorageClass storage;
  SPIRType *var_type;
  SPIRType *type;
  SPIRVariable *var;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *decl;
  
  var = in_RDX;
  arg_local = arg;
  this_local = this;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(in_RDX->super_IVariant)._vptr_IVariant + 4));
  type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)arg,uVar2);
  var_type = Compiler::get_variable_data_type((Compiler *)arg,(SPIRVariable *)type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
  pSStack_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
  name_id = pSStack_38->storage;
  constref = (bool)(pSStack_38->pointer & 1);
  local_44 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  if (((var->storage & StorageClassInput) != StorageClassUniformConstant) &&
     (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c), uVar2 != 0)) {
    local_44 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
  }
  local_421 = false;
  if (((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
     (local_421 = false, (constref & 1U) != 0)) {
    local_421 = *(int *)&(var->super_IVariant).field_0xc == 0;
  }
  local_45 = local_421;
  bVar1 = type_is_msl_framebuffer_fetch((CompilerMSL *)arg,var_type);
  if (bVar1) {
    local_45 = false;
  }
  local_422 = true;
  if ((*(int *)&(var_type->super_IVariant).field_0xc != 0x10) &&
     (local_422 = true, *(int *)&(var_type->super_IVariant).field_0xc != 0x11)) {
    local_422 = *(int *)&(var_type->super_IVariant).field_0xc == 0x12;
  }
  local_46 = local_422;
  bVar1 = VectorView<unsigned_int>::empty(&(var_type->array).super_VectorView<unsigned_int>);
  if ((!bVar1) && ((local_46 & 1U) != 0)) {
    local_45 = true;
  }
  local_47 = '\0';
  ::std::__cxx11::string::string((string *)this);
  if ((local_45 & 1U) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,"const ");
  }
  local_423 = false;
  if ((((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
      (local_423 = false, *(int *)&(var_type->super_IVariant).field_0xc == 0x11)) &&
     (local_423 = false, (var_type->image).dim == Dim2D)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->image);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    bVar1 = type_is_floating_point(pSVar3);
    local_423 = false;
    if (bVar1) {
      local_5c = SPVFuncImplDynamicImageSampler;
      sVar4 = ::std::
              set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
              ::count((set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
                       *)&arg[0x1da].read_count,&local_5c);
      local_423 = sVar4 != 0;
    }
  }
  local_55 = local_423;
  get_argument_address_space_abi_cxx11_((CompilerMSL *)local_80,(SPIRVariable *)arg);
  local_81 = Compiler::is_builtin_variable((Compiler *)arg,(SPIRVariable *)type);
  arg[0x1f5].field_0x12 = local_81;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"threadgroup");
  if (bVar1) {
    arg[0x1f5].field_0x12 = 1;
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
  builtin_00 = (BuiltIn)arg;
  if ((uVar2 == 0) ||
     ((bVar1 = TypedID<(spirv_cross::Types)2>::operator==
                         ((TypedID<(spirv_cross::Types)2> *)&type->field_0x1c,
                          (TypedID<(spirv_cross::Types)2> *)(arg + 0x1f5)), !bVar1 &&
      (bVar1 = TypedID<(spirv_cross::Types)2>::operator==
                         ((TypedID<(spirv_cross::Types)2> *)&type->field_0x1c,
                          (TypedID<(spirv_cross::Types)2> *)&arg[0x1f5].id), !bVar1)))) {
    if ((local_81 & 1) == 0) {
      if (((name_id == 2) || (name_id == 0xc)) &&
         (bVar1 = Compiler::is_array((Compiler *)arg,var_type), pSVar3 = var_type, bVar1)) {
        arg[0x1f5].field_0x12 = 1;
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(local_110,arg,pSVar3,uVar2);
        join<std::__cxx11::string,char_const(&)[2]>(local_f0,local_110,(char (*) [2])0x4e5bc6);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_f0);
        ::std::__cxx11::string::~string((string *)local_f0);
        ::std::__cxx11::string::~string((string *)local_110);
      }
      else {
        pSVar3 = var_type;
        if ((local_55 & 1U) == 0) {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          (**(code **)(*(long *)arg + 0x98))(local_170,arg,pSVar3,uVar2);
          ::std::__cxx11::string::operator+=((string *)this,local_170);
          ::std::__cxx11::string::~string(local_170);
        }
        else {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->image);
          pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
          (**(code **)(*(long *)arg + 0x98))(local_150,arg,pSVar3,0);
          join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                    (local_130,(char (*) [24])"spvDynamicImageSampler<",local_150,
                     (char (*) [2])0x4e5879);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_130);
          ::std::__cxx11::string::~string((string *)local_130);
          ::std::__cxx11::string::~string((string *)local_150);
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          Compiler::set_extended_decoration
                    ((Compiler *)arg,uVar2,SPIRVCrossDecorationDynamicImageSampler,0);
        }
      }
    }
    else {
      local_cc = *(uint32_t *)((long)&(var->super_IVariant)._vptr_IVariant + 4);
      uVar2 = Compiler::get_decoration((Compiler *)arg,(ID)local_cc,DecorationBuiltIn);
      TypedID::operator_cast_to_unsigned_int
                ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
      builtin_type_decl_abi_cxx11_((CompilerMSL *)local_c8,builtin_00,uVar2);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_c8);
      ::std::__cxx11::string::~string((string *)local_c8);
    }
  }
  else {
    pSVar3 = var_type;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
    (**(code **)(*(long *)arg + 0x98))(local_c8 + 0x20,arg,pSVar3,uVar2);
    ::std::__cxx11::string::operator+=((string *)this,(string *)(local_c8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_c8 + 0x20));
  }
  local_171 = name_id == 0;
  if (((((local_81 & 1) != 0) || ((bool)local_171)) || ((constref & 1U) != 0)) ||
     ((name_id != 7 && (name_id != 8)))) {
    bVar1 = Compiler::is_array((Compiler *)arg,var_type);
    if ((bVar1) && ((local_46 & 1U) == 0)) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char (*) [2])0x4e078e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_268);
        ::std::__cxx11::string::~string((string *)local_268);
      }
      if ((arg[0x1d9].read_count & 1) != 0) {
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&restrict_kw_1,local_44);
        restrict_kw_1._4_4_ =
             Compiler::get_decoration((Compiler *)arg,restrict_kw_1._0_4_,DecorationDescriptorSet);
        if (((name_id == 2) || (name_id == 0xc)) &&
           (bVar1 = descriptor_set_is_argument_buffer((CompilerMSL *)arg,restrict_kw_1._4_4_), bVar1
           )) {
          if ((arg[0x226].id.id & 1 << ((byte)restrict_kw_1._4_4_ & 0x1f)) == 0) {
            ::std::__cxx11::string::operator+=((string *)this," constant");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)this," const device");
          }
        }
      }
      ::std::__cxx11::string::operator+=((string *)this," (&");
      local_298._32_8_ = to_restrict((CompilerMSL *)arg,local_44,true);
      if ((char)*(uint *)local_298._32_8_ != '\0') {
        ::std::__cxx11::string::operator+=((string *)this," ");
        ::std::__cxx11::string::operator+=((string *)this,(char *)local_298._32_8_);
      }
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_298,builtin_00,SUB41(local_44,0))
      ;
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_298);
      ::std::__cxx11::string::~string((string *)local_298);
      ::std::__cxx11::string::operator+=((string *)this,")");
      (**(code **)(*(long *)arg + 0x118))(local_2b8,arg,var_type);
      ::std::__cxx11::string::operator+=((string *)this,local_2b8);
      ::std::__cxx11::string::~string(local_2b8);
    }
    else if ((local_171 & 1) == 0) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar6 = (char *)::std::__cxx11::string::back();
        if (*pcVar6 == '*') {
          join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (local_2d8,(char (*) [2])0x4e078e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char (*) [2])0x4e078e);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_2d8);
          ::std::__cxx11::string::~string((string *)local_2d8);
        }
        else {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    ((spirv_cross *)(local_318 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char (*) [2])0x4e078e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          ::std::__cxx11::string::operator=((string *)this,(string *)(local_318 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_318 + 0x20));
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,"&");
      ::std::__cxx11::string::operator+=((string *)this," ");
      pcVar6 = to_restrict((CompilerMSL *)arg,local_44,true);
      ::std::__cxx11::string::operator+=((string *)this,pcVar6);
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_318,builtin_00,SUB41(local_44,0))
      ;
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_318);
      ::std::__cxx11::string::~string((string *)local_318);
    }
    else {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char (*) [2])0x4e078e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_338);
        ::std::__cxx11::string::~string((string *)local_338);
      }
      ::std::__cxx11::string::operator+=((string *)this," ");
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)&backing_var,builtin_00,SUB41(local_44,0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)&backing_var);
      ::std::__cxx11::string::~string((string *)&backing_var);
    }
  }
  else if (((arg[0x1d9].field_0x12 & 1) == 0) ||
          (bVar1 = Compiler::is_array((Compiler *)arg,var_type), !bVar1)) {
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                ((spirv_cross *)(local_248 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (char (*) [2])0x4e078e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      ::std::__cxx11::string::operator=((string *)this,(string *)(local_248 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_248 + 0x20));
    }
    ::std::__cxx11::string::operator+=((string *)this," ");
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_248,builtin_00,SUB41(local_44,0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_248);
    ::std::__cxx11::string::~string((string *)local_248);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1b8,"thread const ",(allocator *)((long)&restrict_kw + 7));
    ::std::operator+(local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
    ;
    ::std::__cxx11::string::operator=((string *)this,(string *)local_198);
    ::std::__cxx11::string::~string((string *)local_198);
    ::std::__cxx11::string::~string(local_1b8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&restrict_kw + 7));
    ::std::__cxx11::string::operator+=((string *)this," (&");
    local_1e8._32_8_ = to_restrict((CompilerMSL *)arg,local_44,true);
    if ((char)*(uint *)local_1e8._32_8_ != '\0') {
      ::std::__cxx11::string::operator+=((string *)this," ");
      ::std::__cxx11::string::operator+=((string *)this,(char *)local_1e8._32_8_);
    }
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_1e8,builtin_00,SUB41(local_44,0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_1e8);
    ::std::__cxx11::string::operator+=((string *)this,")");
    (**(code **)(*(long *)arg + 0x118))(local_208,arg,var_type);
    ::std::__cxx11::string::operator+=((string *)this,local_208);
    ::std::__cxx11::string::~string(local_208);
  }
  local_360 = Compiler::maybe_get_backing_variable((Compiler *)arg,local_44);
  bVar1 = false;
  if (local_360 != (SPIRVariable *)0x0) {
    local_364 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_360->super_IVariant).self)
    ;
    sVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&arg[0x219].write_count,&local_364);
    bVar1 = sVar7 != 0;
  }
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_38->image);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    (**(code **)(*(long *)arg + 0x98))(local_3a8,arg,pSVar3,0);
    ::std::operator+((char *)local_388,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ", device atomic_");
    ::std::__cxx11::string::operator+=((string *)this,local_388);
    ::std::__cxx11::string::~string(local_388);
    ::std::__cxx11::string::~string(local_3a8);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_408,builtin_00,SUB41(local_44,0));
    ::std::operator+(local_408 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f3a07);
    ::std::operator+(local_3c8,local_408 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c8);
    ::std::__cxx11::string::~string((string *)local_3c8);
    ::std::__cxx11::string::~string((string *)(local_408 + 0x20));
    ::std::__cxx11::string::~string((string *)local_408);
  }
  arg[0x1f5].field_0x12 = 0;
  local_47 = 1;
  ::std::__cxx11::string::~string((string *)local_80);
  if ((local_47 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// Arrays of images/samplers in MSL are always const.
	if (!type.array.empty() && type_is_image)
		constref = true;

	string decl;
	if (constref)
		decl += "const ";

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = is_builtin_variable(var);
	is_using_builtin_array = builtin;
	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl += type_to_glsl(type, arg.id);
	else if (builtin)
		decl += builtin_type_decl(static_cast<BuiltIn>(get_decoration(arg.id, DecorationBuiltIn)), arg.id);
	else if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl += join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
		decl += type_to_glsl(type, arg.id);

	bool opaque_handle = storage == StorageClassUniformConstant;

	if (!builtin && !opaque_handle && !is_pointer &&
	    (storage == StorageClassFunction || storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of images and samplers are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		if (msl_options.argument_buffers)
		{
			uint32_t desc_set = get_decoration(name_id, DecorationDescriptorSet);
			if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) &&
			    descriptor_set_is_argument_buffer(desc_set))
			{
				// An awkward case where we need to emit *more* address space declarations (yay!).
				// An example is where we pass down an array of buffer pointers to leaf functions.
				// It's a constant array containing pointers to constants.
				// The pointer array is always constant however. E.g.
				// device SSBO * constant (&array)[N].
				// const device SSBO * constant (&array)[N].
				// constant SSBO * constant (&array)[N].
				// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
				// we emit the buffer array on stack instead, and that seems to work just fine apparently.

				// If the argument was marked as being in device address space, any pointer to member would
				// be const device, not constant.
				if (argument_buffer_device_storage_mask & (1u << desc_set))
					decl += " const device";
				else
					decl += " constant";
			}
		}

		decl += " (&";
		const char *restrict_kw = to_restrict(name_id);
		if (*restrict_kw)
		{
			decl += " ";
			decl += restrict_kw;
		}
		decl += to_expression(name_id);
		decl += ")";
		decl += type_to_array_glsl(type);
	}
	else if (!opaque_handle)
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (decl.back() == '*')
				decl += join(" ", address_space, " ");
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id);
		decl += to_expression(name_id);
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}